

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O1

void test_mp_rshift_safe(void)

{
  _func_size_t_size_t *p_Var1;
  mp_int *x;
  size_t sVar2;
  mp_int *x_00;
  size_t sVar3;
  
  x = mp_random_bits_fn(0x100,random_read);
  p_Var1 = looplimit;
  sVar2 = mp_max_bits(x);
  sVar2 = (*p_Var1)(sVar2 + 1);
  if (sVar2 != 0) {
    sVar2 = 0;
    do {
      test_index = test_index + 1;
      last_filename = dupprintf("%s/%s.%04zu",outdir,test_basename);
      (*log_to_file)(last_filename);
      x_00 = mp_rshift_safe(x,sVar2);
      (*log_to_file)((char *)0x0);
      safefree(last_filename);
      mp_free(x_00);
      p_Var1 = looplimit;
      sVar2 = sVar2 + 1;
      sVar3 = mp_max_bits(x);
      sVar3 = (*p_Var1)(sVar3 + 1);
    } while (sVar2 < sVar3);
  }
  mp_free(x);
  return;
}

Assistant:

static void test_mp_rshift_safe(void)
{
    mp_int *x = mp_random_bits(256);

    for (size_t i = 0; i < looplimit(mp_max_bits(x)+1); i++) {
        log_start();
        mp_int *r = mp_rshift_safe(x, i);
        log_end();
        mp_free(r);
    }

    mp_free(x);
}